

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestCharReaderTestparseWithNoErrorsTestingOffsets::runTestCase
          (TestCharReaderTestparseWithNoErrorsTestingOffsets *this)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  CharReader *file;
  long lVar4;
  char *in_RDI;
  bool ok;
  char doc [111];
  Value root;
  string errs;
  CharReader *reader;
  CharReaderBuilder b;
  undefined7 in_stack_fffffffffffffed0;
  CharReaderBuilder *this_00;
  uint line;
  undefined7 in_stack_fffffffffffffef0;
  char local_108 [8];
  undefined4 in_stack_ffffffffffffff00;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 uVar6;
  char acStack_a1 [9];
  undefined1 local_98 [40];
  string local_70 [48];
  CharReader *local_40;
  CharReaderBuilder local_38;
  
  this_00 = &local_38;
  Json::CharReaderBuilder::CharReaderBuilder(this_00);
  file = Json::CharReaderBuilder::newCharReader
                   ((CharReaderBuilder *)
                    CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  local_40 = file;
  std::__cxx11::string::string(local_70);
  Json::Value::Value((Value *)this_00,(ValueType)((ulong)in_RDI >> 0x20));
  line = (uint)((ulong)this_00 >> 0x20);
  builtin_strncpy(acStack_a1,"false }",8);
  builtin_strncpy(local_108,"{ \"prope",8);
  uVar5._0_1_ = 'r';
  uVar5._1_1_ = 't';
  uVar5._2_1_ = 'y';
  uVar5._3_1_ = '\"';
  uVar6._0_1_ = ' ';
  uVar6._1_1_ = ':';
  uVar6._2_1_ = ' ';
  uVar6._3_1_ = '[';
  uVar3 = (*local_40->_vptr_CharReader[2])(local_40,local_108,acStack_a1 + 7,local_98,local_70);
  bVar1 = (byte)uVar3;
  bVar2 = bVar1 & 1;
  if ((uVar3 & 1) == 0) {
    JsonTest::TestResult::addFailure
              ((TestResult *)(CONCAT17(bVar1,in_stack_fffffffffffffef0) & 0x1ffffffffffffff),
               (char *)file,line,in_RDI);
  }
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    JsonTest::TestResult::addFailure
              ((TestResult *)CONCAT17(bVar2,in_stack_fffffffffffffef0),(char *)file,line,in_RDI);
  }
  if (local_40 != (CharReader *)0x0) {
    (*local_40->_vptr_CharReader[1])();
  }
  Json::Value::~Value((Value *)CONCAT44(uVar6,uVar5));
  std::__cxx11::string::~string(local_70);
  Json::CharReaderBuilder::~CharReaderBuilder
            ((CharReaderBuilder *)CONCAT17(bVar1,in_stack_fffffffffffffed0));
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseWithNoErrorsTestingOffsets) {
  Json::CharReaderBuilder b;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  Json::Value root;
  char const doc[] =
                         "{ \"property\" : [\"value\", \"value2\"], \"obj\" : "
                         "{ \"nested\" : 123, \"bool\" : true}, \"null\" : "
                         "null, \"false\" : false }";
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT(errs.size() == 0);
  delete reader;
}